

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O3

void testutil_random_fe(secp256k1_fe *x)

{
  uchar bin [32];
  uchar auStack_48 [32];
  
  while( true ) {
    testrand256(auStack_48);
    secp256k1_fe_impl_set_b32_mod(x,auStack_48);
    if (((x->n[0] < 0xffffefffffc2f) || (x->n[4] != 0xffffffffffff)) ||
       ((x->n[2] & x->n[3] & x->n[1]) != 0xfffffffffffff)) break;
    x->magnitude = -1;
  }
  x->magnitude = 1;
  x->normalized = 1;
  secp256k1_fe_verify(x);
  return;
}

Assistant:

static void testutil_random_fe(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        testrand256(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}